

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector3T.h
# Opt level: O3

bool compare(Vector3 *a,Vector3 *b,string *str,double epsilon)

{
  ostream *poVar1;
  long *plVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = a->m_x - b->m_x;
  dVar3 = a->m_y - b->m_y;
  dVar4 = a->m_z - b->m_z;
  dVar3 = SQRT(dVar4 * dVar4 + dVar5 * dVar5 + dVar3 * dVar3);
  if (epsilon <= dVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in ",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    poVar1 = std::ostream::_M_insert<double>(a->m_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(a->m_y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(a->m_z);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    plVar2 = (long *)std::ostream::flush();
    poVar1 = std::ostream::_M_insert<double>(b->m_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(b->m_y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(b->m_z);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  return dVar3 < epsilon;
}

Assistant:

inline Vector3T operator-(const struct Vector3T<T, b> & v) const
  {
    Vector3T vr;
    vr.m_x = m_x - v.m_x;
    vr.m_y = m_y - v.m_y;
    vr.m_z = m_z - v.m_z;
    return vr;
  }